

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O0

void __thiscall APowerMask::DoEffect(APowerMask *this)

{
  AActor *ent;
  FSoundID local_14;
  APowerMask *local_10;
  APowerMask *this_local;
  
  local_10 = this;
  APowerIronFeet::DoEffect(&this->super_APowerIronFeet);
  if ((::level.time & 0x3fU) == 0) {
    ent = ::TObjPtr::operator_cast_to_AActor_
                    ((TObjPtr *)&(this->super_APowerIronFeet).super_APowerup.super_AInventory.Owner)
    ;
    FSoundID::FSoundID(&local_14,"misc/mask");
    S_Sound(ent,0,&local_14,1.0,3.0);
  }
  return;
}

Assistant:

void APowerMask::DoEffect ()
{
	Super::DoEffect ();
	if (!(level.time & 0x3f))
	{
		S_Sound (Owner, CHAN_AUTO, "misc/mask", 1, ATTN_STATIC);
	}
}